

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O3

void __thiscall rst::Parser::ParseLineBlock(Parser *this,BlockType *prev_type,int indent)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  string text;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  bVar6 = true;
  do {
    pcVar4 = this->ptr_;
    pcVar5 = pcVar4;
    if (!bVar6) {
      pcVar4 = pcVar4 + 2;
      lVar3 = (long)indent;
      while( true ) {
        bVar1 = pcVar4[-2];
        if ((0x20 < (ulong)bVar1) || ((0x100001a00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
        this->ptr_ = pcVar4 + -1;
        pcVar4 = pcVar4 + 1;
        lVar3 = lVar3 + -1;
      }
      if (((bVar1 != 0x7c) ||
          (((0x20 < (ulong)(byte)pcVar4[-1] ||
            ((0x100001a00U >> ((ulong)(byte)pcVar4[-1] & 0x3f) & 1) == 0)) || (lVar3 != 0)))) ||
         (this->ptr_ = pcVar4, pcVar5 = pcVar4, *pcVar4 == '\0')) {
        if (*prev_type != LINE_BLOCK) {
          if (*prev_type == LIST_ITEM) {
            (*this->handler_->_vptr_ContentHandler[3])();
          }
          *prev_type = LINE_BLOCK;
        }
        (*this->handler_->_vptr_ContentHandler[2])(this->handler_,1);
        (*this->handler_->_vptr_ContentHandler[4])(this->handler_,local_50,local_48);
        (*this->handler_->_vptr_ContentHandler[3])();
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        return;
      }
    }
    while (cVar2 = *pcVar4, cVar2 != '\0') {
      pcVar4 = pcVar4 + 1;
      if (cVar2 == '\n') {
        this->ptr_ = pcVar4;
        break;
      }
      this->ptr_ = pcVar4;
    }
    bVar6 = false;
    std::__cxx11::string::replace((ulong)&local_50,local_48,(char *)0x0,(ulong)pcVar5);
  } while( true );
}

Assistant:

void rst::Parser::ParseLineBlock(rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (*ptr_ != '|' || !IsSpace(ptr_[1]) || ptr_ - line_start != indent)
        break;
      ptr_ += 2;
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;
    if (*ptr_ == '\n')
      ++ptr_;
    text.append(line_start, ptr_);
  }

  EnterBlock(prev_type, rst::LINE_BLOCK);
  handler_->StartBlock(rst::LINE_BLOCK);
  handler_->HandleText(text.c_str(), text.size());
  handler_->EndBlock();
}